

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_IndexInitializationListCtorCheck_Test<unsigned_short>::
SparseArray_IndexInitializationListCtorCheck_Test
          (SparseArray_IndexInitializationListCtorCheck_Test<unsigned_short> *this)

{
  anon_unknown.dwarf_c17be::SparseArray<unsigned_short>::SparseArray
            (&this->super_SparseArray<unsigned_short>);
  (this->super_SparseArray<unsigned_short>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_002264b0;
  return;
}

Assistant:

TYPED_TEST (SparseArray, IndexInitializationListCtorCheck) {
    ctor_counter::ctors = 0;

    auto arrp = sparse_array<ctor_counter, TypeParam>::make_unique ({0, 2, 4});
    auto & arr = *arrp;
    EXPECT_EQ (arr[0].v, 0U);
    EXPECT_EQ (arr[2].v, 1U);
    EXPECT_EQ (arr[4].v, 2U);
}